

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::js::api::json::BlindIssuanceRequest::ConvertFromStruct
          (BlindIssuanceRequest *this,BlindIssuanceRequestStruct *data)

{
  BlindIssuanceRequestStruct *data_local;
  BlindIssuanceRequest *this_local;
  
  std::__cxx11::string::operator=((string *)&this->txid_,(string *)data);
  this->vout_ = data->vout;
  std::__cxx11::string::operator=
            ((string *)&this->asset_blinding_key_,(string *)&data->asset_blinding_key);
  std::__cxx11::string::operator=
            ((string *)&this->token_blinding_key_,(string *)&data->token_blinding_key);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->ignore_items,&data->ignore_items);
  return;
}

Assistant:

void BlindIssuanceRequest::ConvertFromStruct(
    const BlindIssuanceRequestStruct& data) {
  txid_ = data.txid;
  vout_ = data.vout;
  asset_blinding_key_ = data.asset_blinding_key;
  token_blinding_key_ = data.token_blinding_key;
  ignore_items = data.ignore_items;
}